

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

clock_id_t __thiscall
tchecker::reference_clock_variables_t::declare
          (reference_clock_variables_t *this,string *name,string *refclock)

{
  uint refid_00;
  clock_id_t cVar1;
  clock_id_t id;
  clock_id_t refid;
  string *refclock_local;
  string *name_local;
  reference_clock_variables_t *this_local;
  
  refid_00 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::id((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,refclock);
  if (refid_00 < this->_refcount) {
    cVar1 = declare(this,name,refid_00);
    return cVar1;
  }
  __assert_fail("refid < _refcount",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                ,0x1af,
                "tchecker::clock_id_t tchecker::reference_clock_variables_t::declare(const std::string &, const std::string &)"
               );
}

Assistant:

tchecker::clock_id_t reference_clock_variables_t::declare(std::string const & name, std::string const & refclock)
{
  tchecker::clock_id_t refid = 0;
  try {
    refid = tchecker::flat_clock_variables_t::id(refclock);
  }
  catch (...) {
    throw std::invalid_argument("unknown reference clock " + refclock);
  }
  assert(refid < _refcount);
  tchecker::clock_id_t id = declare(name, refid);
  return id;
}